

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O1

void __thiscall
absl::lts_20250127::inlined_vector_internal::
Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
::DestroyContents(Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
                  *this)

{
  Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_> pPVar1;
  ulong uVar2;
  
  uVar2 = (this->metadata_).
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
          .super_Storage<unsigned_long,_1UL,_false>.value;
  if ((uVar2 & 1) == 0) {
    pPVar1 = (Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_>)&this->data_;
  }
  else {
    pPVar1 = (this->data_).allocated.allocated_data;
  }
  if (1 < uVar2) {
    uVar2 = uVar2 >> 1;
    pPVar1 = pPVar1 + uVar2;
    do {
      pPVar1 = pPVar1 + -1;
      __gnu_cxx::new_allocator<absl::lts_20250127::status_internal::Payload>::
      destroy<absl::lts_20250127::status_internal::Payload>
                ((new_allocator<absl::lts_20250127::status_internal::Payload> *)this,pPVar1);
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  if (((this->metadata_).
       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
       .super_Storage<unsigned_long,_1UL,_false>.value & 1) == 0) {
    return;
  }
  operator_delete((this->data_).allocated.allocated_data,
                  (this->data_).allocated.allocated_capacity * 0x30);
  return;
}

Assistant:

void Storage<T, N, A>::DestroyContents() {
  Pointer<A> data = GetIsAllocated() ? GetAllocatedData() : GetInlinedData();
  DestroyAdapter<A>::DestroyElements(GetAllocator(), data, GetSize());
  DeallocateIfAllocated();
}